

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# movegen.h
# Opt level: O3

Move * puppup::movegen::moveCommand
                 (Move *__return_storage_ptr__,idx step,idx cursor,string *word_s,State *state,
                 Gaddag *gaddag)

{
  long lVar1;
  long lVar2;
  byte bVar3;
  size_type sVar4;
  ostream *poVar5;
  idx iVar6;
  long lVar7;
  long lVar8;
  byte *pbVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  bool bVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  byte local_c9;
  long local_c8;
  long local_c0;
  State *local_b8;
  byte *local_b0;
  long local_a8;
  ulong local_a0;
  long local_98;
  Gaddag *local_90;
  long local_88;
  long local_80;
  long local_78;
  long local_70;
  long *local_68;
  long local_60;
  idx local_58;
  Move *local_50;
  string *local_48;
  long local_40;
  byte *local_38;
  
  lVar14 = (((gaddag->nodes_).
             super__Vector_base<puppup::trie::Gaddag::Node,_std::allocator<puppup::trie::Gaddag::Node>_>
             ._M_impl.super__Vector_impl_data._M_start)->children)._M_elems[0x1f];
  sVar4 = word_s->_M_string_length;
  local_90 = gaddag;
  if (sVar4 != 0) {
    pbVar9 = (byte *)(word_s->_M_dataplus)._M_p;
    local_68 = (state->letter_score)._M_elems + cursor;
    local_a0 = 0;
    local_98 = 0;
    local_70 = 0;
    local_a8 = 0;
    local_38 = pbVar9 + sVar4;
    local_60 = sVar4 * step;
    local_40 = step * 8;
    local_c0 = 1;
    local_b8 = state;
    local_58 = cursor;
    local_50 = __return_storage_ptr__;
    local_48 = word_s;
LAB_00107c33:
    bVar3 = *pbVar9;
    if ((byte)(bVar3 + 0x9f) < 0x1a) {
      lVar7 = *(long *)(stridx + (ulong)bVar3 * 8);
      local_c8 = lVar7;
    }
    else {
      if ((byte)(bVar3 + 0xbf) < 0x1a) {
        lVar7 = *(long *)(stridx + ((bVar3 | 0x20) << 3));
        local_a0 = local_a0 << 0x10 | cursor + 1U;
      }
      else {
        local_c8 = lVar14;
        local_b0 = pbVar9;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"unexpected character! ",0x16);
        local_c9 = bVar3;
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,(char *)&local_c9,1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        lVar7 = 0x1a;
        pbVar9 = local_b0;
        state = local_b8;
        lVar14 = local_c8;
      }
      local_c8 = 0x1a;
    }
    if (lVar14 == -1) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"move command contains illegal word! ",0x24);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(local_48->_M_dataplus)._M_p,
                          local_48->_M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      lVar14 = -1;
      state = local_b8;
    }
    else {
      lVar14 = (local_90->nodes_).
               super__Vector_base<puppup::trie::Gaddag::Node,_std::allocator<puppup::trie::Gaddag::Node>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar14].children._M_elems[lVar7];
    }
    if ((state->board)._M_elems[cursor] == 0x1b) {
      local_80 = (&board::word_multiplier)[cursor];
      lVar10 = -1;
      lVar11 = -8;
      lVar12 = -2;
      bVar13 = false;
      local_88 = (&board::letter_multiplier)[cursor];
      local_78 = (&scores)[local_c8];
      lVar7 = 0;
      do {
        lVar15 = -0x10;
        if (step < 1) {
          if (step == -0x10) {
LAB_00107e15:
            lVar15 = -1;
          }
          else if (step != -1) {
LAB_00107e1e:
            lVar15 = 0;
          }
        }
        else if (step != 1) {
          if (step != 0x10) goto LAB_00107e1e;
          goto LAB_00107e15;
        }
        uVar16 = cursor + lVar15 * lVar10;
        if ((uVar16 < 0xf1 && (uVar16 & 0x800000000000000f) != 0xf) &&
           ((&board::word_multiplier)[uVar16] != 0)) {
          lVar8 = lVar15 * lVar11;
          lVar17 = 0;
          uVar16 = lVar15 * lVar12 + cursor;
          lVar2 = uVar16 * 8;
          do {
            if (*(long *)((long)local_68 + lVar17 + lVar8 + -0x800) == 0x1b) break;
            lVar7 = lVar7 + *(long *)((long)local_68 + lVar17 + lVar8);
            if ((0xf0 < uVar16) || ((uVar16 & 0x800000000000000f) == 0xf)) {
              bVar13 = true;
              if (-1 < lVar10) goto LAB_00107f2b;
              goto LAB_00107eb0;
            }
            lVar1 = lVar2 + lVar17;
            lVar17 = lVar17 + lVar8;
            uVar16 = uVar16 + lVar15 * lVar10;
            bVar13 = true;
          } while (*(long *)((long)&board::word_multiplier + lVar1) != 0);
        }
        if (-1 < lVar10) goto LAB_00107efd;
LAB_00107eb0:
        lVar10 = lVar10 + 2;
        lVar11 = lVar11 + 0x10;
        lVar12 = lVar12 + 4;
      } while( true );
    }
    lVar7 = (state->letter_score)._M_elems[cursor];
    goto LAB_00107f41;
  }
  local_c0 = 1;
  local_70 = 0;
  local_98 = 0;
  local_a0 = 0;
  lVar7 = 0;
LAB_00107fb3:
  if (lVar14 == -1) {
    iVar6 = -1;
  }
  else {
    iVar6 = (local_90->node_to_word_).super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_start[lVar14];
  }
  __return_storage_ptr__->score = lVar7 + local_98 + local_70 * local_c0;
  __return_storage_ptr__->word = iVar6;
  __return_storage_ptr__->cursor = cursor;
  __return_storage_ptr__->step = step;
  __return_storage_ptr__->blanks = local_a0;
  return __return_storage_ptr__;
LAB_00107efd:
  if (bVar13) {
LAB_00107f2b:
    local_98 = local_98 + (lVar7 + local_78 * local_88) * local_80;
  }
  local_a8 = local_a8 + 1;
  local_c0 = local_c0 * local_80;
  lVar7 = local_78 * local_88;
  state = local_b8;
  local_b0 = pbVar9;
LAB_00107f41:
  local_70 = local_70 + lVar7;
  cursor = cursor + step;
  pbVar9 = pbVar9 + 1;
  local_68 = (long *)((long)local_68 + local_40);
  if (pbVar9 == local_38) goto code_r0x00107f67;
  goto LAB_00107c33;
code_r0x00107f67:
  cursor = local_58 + local_60;
  lVar7 = 0x23;
  __return_storage_ptr__ = local_50;
  if (local_a8 < 7) {
    lVar7 = 0;
  }
  goto LAB_00107fb3;
}

Assistant:

inline Move moveCommand(idx step, idx cursor, std::string word_s,
                        const board::State& state, const trie::Gaddag& gaddag) {
    idx blanks = 0;
    idx non_multipliable_score = 0;
    idx multipliable_score = 0;
    idx word_mult = 1;
    trie::nodeid node = gaddag.get(0, trie::rev_marker);
    idx placed = 0;
    for (char c : word_s) {
        chr letter = blank;
        chr actual_letter = blank;
        if (c >= 'a' && c <= 'z') {
            actual_letter = letter = stridx[(idx)c];
        } else if (c >= 'A' && c <= 'Z') {
            letter = stridx[(idx)c + 'a' - 'A'];
            actual_letter = blank;
            blanks <<= idx(16LL);
            blanks |= cursor + 1;
        } else {
            std::cerr << "unexpected character! " << c << std::endl;
        }
        if (node != -1) {
            node = gaddag.get(node, letter);
        } else {
            std::cerr << "move command contains illegal word! " << word_s
                      << std::endl;
        }
        if (state.board[cursor] == emptiness) {
            ++placed;
            multipliable_score +=
                board::letter_multiplier[cursor] * scores[actual_letter];
            word_mult *= board::word_multiplier[cursor];

            idx orth_score = 0;
            bool works = false;
            for (idx o = -1; o <= 1; o += 2) {
                idx ostep = __impl::turn(step) * o;
                for (idx ocursor = cursor + ostep;
                     !__impl::edge(ocursor) &&
                     state.board[ocursor] != emptiness;
                     ocursor += ostep) {
                    orth_score += state.letter_score[ocursor];
                    works = true;
                }
            }

            if (works) {
                orth_score +=
                    board::letter_multiplier[cursor] * scores[actual_letter];
                non_multipliable_score +=
                    orth_score * board::word_multiplier[cursor];
            }
        } else {
            multipliable_score += state.letter_score[cursor];
        }
        cursor += step;
    }
    const idx bingo = placed >= 7 ? bingo_bonus : 0;
    const idx score =
        non_multipliable_score + word_mult * multipliable_score + bingo;
    // std::cerr << "nms: " << non_multipliable_score << std::endl;
    // std::cerr << "ms: " << multipliable_score << std::endl;
    // std::cerr << "mult: " << word_mult << std::endl;
    const idx wordid = node == -1 ? -1 : gaddag.nodeToWord(node);
    return Move{score, wordid, cursor, step, blanks};
}